

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerVariables.cxx
# Opt level: O0

void __thiscall
cmDebugger::cmDebuggerVariables::cmDebuggerVariables
          (cmDebuggerVariables *this,
          shared_ptr<cmDebugger::cmDebuggerVariablesManager> *variablesManager,string *name,
          bool supportsVariableType,
          function<std::vector<cmDebugger::cmDebuggerVariableEntry,_std::allocator<cmDebugger::cmDebuggerVariableEntry>_>_()>
          *getKeyValuesFunction)

{
  int64_t id;
  undefined1 *puVar1;
  element_type *this_00;
  anon_class_8_1_8991fb9c local_80;
  function<std::vector<dap::Variable,_std::allocator<dap::Variable>_>_(const_dap::VariablesRequest_&)>
  local_78;
  function<std::vector<cmDebugger::cmDebuggerVariableEntry,_std::allocator<cmDebugger::cmDebuggerVariableEntry>_>_()>
  *local_58;
  function<std::vector<cmDebugger::cmDebuggerVariableEntry,_std::allocator<cmDebugger::cmDebuggerVariableEntry>_>_()>
  *getKeyValuesFunction_local;
  string *psStack_48;
  bool supportsVariableType_local;
  string *name_local;
  shared_ptr<cmDebugger::cmDebuggerVariablesManager> *variablesManager_local;
  cmDebuggerVariables *this_local;
  undefined8 local_28;
  undefined4 local_1c;
  undefined8 local_18;
  undefined8 *local_10;
  
  this->_vptr_cmDebuggerVariables = (_func_int **)&PTR_HandleVariablesRequest_0167d740;
  local_10 = &NextId;
  local_18 = 1;
  local_1c = 5;
  local_28 = 1;
  LOCK();
  UNLOCK();
  this_local = NextId;
  puVar1 = (undefined1 *)((long)&NextId->_vptr_cmDebuggerVariables + 1);
  this->Id = (int64_t)NextId;
  NextId = (cmDebuggerVariables *)puVar1;
  local_58 = getKeyValuesFunction;
  getKeyValuesFunction_local._7_1_ = supportsVariableType;
  psStack_48 = name;
  name_local = (string *)variablesManager;
  variablesManager_local = (shared_ptr<cmDebugger::cmDebuggerVariablesManager> *)this;
  std::__cxx11::string::string((string *)&this->Name,(string *)name);
  std::__cxx11::string::string((string *)&this->Value);
  std::
  function<std::vector<cmDebugger::cmDebuggerVariableEntry,_std::allocator<cmDebugger::cmDebuggerVariableEntry>_>_()>
  ::function(&this->GetKeyValuesFunction,getKeyValuesFunction);
  std::
  vector<std::shared_ptr<cmDebugger::cmDebuggerVariables>,_std::allocator<std::shared_ptr<cmDebugger::cmDebuggerVariables>_>_>
  ::vector(&this->SubVariables);
  this->IgnoreEmptyStringEntries = false;
  this->EnableSorting = true;
  this->SupportsVariableType = (bool)(getKeyValuesFunction_local._7_1_ & 1);
  std::shared_ptr<cmDebugger::cmDebuggerVariablesManager>::shared_ptr
            (&this->VariablesManager,variablesManager);
  this_00 = std::
            __shared_ptr_access<cmDebugger::cmDebuggerVariablesManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<cmDebugger::cmDebuggerVariablesManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->VariablesManager);
  id = this->Id;
  local_80.this = this;
  std::
  function<std::vector<dap::Variable,std::allocator<dap::Variable>>(dap::VariablesRequest_const&)>::
  function<cmDebugger::cmDebuggerVariables::cmDebuggerVariables(std::shared_ptr<cmDebugger::cmDebuggerVariablesManager>,std::__cxx11::string,bool,std::function<std::vector<cmDebugger::cmDebuggerVariableEntry,std::allocator<cmDebugger::cmDebuggerVariableEntry>>()>)::__0,void>
            ((function<std::vector<dap::Variable,std::allocator<dap::Variable>>(dap::VariablesRequest_const&)>
              *)&local_78,&local_80);
  cmDebuggerVariablesManager::RegisterHandler(this_00,id,&local_78);
  std::
  function<std::vector<dap::Variable,_std::allocator<dap::Variable>_>_(const_dap::VariablesRequest_&)>
  ::~function(&local_78);
  return;
}

Assistant:

cmDebuggerVariables::cmDebuggerVariables(
  std::shared_ptr<cmDebuggerVariablesManager> variablesManager,
  std::string name, bool supportsVariableType,
  std::function<std::vector<cmDebuggerVariableEntry>()> getKeyValuesFunction)
  : Id(NextId.fetch_add(1))
  , Name(std::move(name))
  , GetKeyValuesFunction(std::move(getKeyValuesFunction))
  , SupportsVariableType(supportsVariableType)
  , VariablesManager(std::move(variablesManager))
{
  VariablesManager->RegisterHandler(
    Id, [this](dap::VariablesRequest const& request) {
      (void)request;
      return this->HandleVariablesRequest();
    });
}